

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::SourceCodeInfo_Location::SerializeWithCachedSizesToArray
          (SourceCodeInfo_Location *this,uint8 *target)

{
  bool bVar1;
  int iVar2;
  uint32 uVar3;
  int32 iVar4;
  char *pcVar5;
  string *psVar6;
  uint8 *puVar7;
  UnknownFieldSet *pUVar8;
  int local_110;
  int local_10c;
  int i_1;
  int i;
  uint8 *target_local;
  SourceCodeInfo_Location *this_local;
  uint8 *local_58;
  byte *local_40;
  byte *local_28;
  byte *local_10;
  
  iVar2 = path_size(this);
  _i_1 = target;
  if (0 < iVar2) {
    uVar3 = internal::WireFormatLite::MakeTag(1,WIRETYPE_LENGTH_DELIMITED);
    if (uVar3 < 0x80) {
      *target = (byte)uVar3;
      local_58 = target + 1;
    }
    else if (uVar3 < 0x4000) {
      *target = (byte)uVar3 | 0x80;
      target[1] = (uint8)(uVar3 >> 7);
      local_58 = target + 2;
    }
    else {
      local_58 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,target);
    }
    _i_1 = io::CodedOutputStream::WriteVarint32ToArray(this->_path_cached_byte_size_,local_58);
  }
  for (local_10c = 0; iVar2 = path_size(this), local_10c < iVar2; local_10c = local_10c + 1) {
    iVar4 = path(this,local_10c);
    _i_1 = io::CodedOutputStream::WriteVarint32SignExtendedToArray(iVar4,_i_1);
  }
  iVar2 = span_size(this);
  if (0 < iVar2) {
    uVar3 = internal::WireFormatLite::MakeTag(2,WIRETYPE_LENGTH_DELIMITED);
    if (uVar3 < 0x80) {
      *_i_1 = (byte)uVar3;
      local_40 = _i_1 + 1;
    }
    else if (uVar3 < 0x4000) {
      *_i_1 = (byte)uVar3 | 0x80;
      _i_1[1] = (byte)(uVar3 >> 7);
      local_40 = _i_1 + 2;
    }
    else {
      local_40 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,_i_1);
    }
    _i_1 = io::CodedOutputStream::WriteVarint32ToArray(this->_span_cached_byte_size_,local_40);
  }
  for (local_110 = 0; iVar2 = span_size(this), local_110 < iVar2; local_110 = local_110 + 1) {
    iVar4 = span(this,local_110);
    _i_1 = io::CodedOutputStream::WriteVarint32SignExtendedToArray(iVar4,_i_1);
  }
  bVar1 = has_leading_comments(this);
  if (bVar1) {
    leading_comments_abi_cxx11_(this);
    pcVar5 = (char *)std::__cxx11::string::data();
    leading_comments_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(pcVar5,iVar2,SERIALIZE);
    psVar6 = leading_comments_abi_cxx11_(this);
    uVar3 = internal::WireFormatLite::MakeTag(3,WIRETYPE_LENGTH_DELIMITED);
    if (uVar3 < 0x80) {
      *_i_1 = (byte)uVar3;
      local_10 = _i_1 + 1;
    }
    else if (uVar3 < 0x4000) {
      *_i_1 = (byte)uVar3 | 0x80;
      _i_1[1] = (byte)(uVar3 >> 7);
      local_10 = _i_1 + 2;
    }
    else {
      local_10 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,_i_1);
    }
    uVar3 = std::__cxx11::string::size();
    puVar7 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,local_10);
    _i_1 = io::CodedOutputStream::WriteStringToArray(psVar6,puVar7);
  }
  bVar1 = has_trailing_comments(this);
  if (bVar1) {
    trailing_comments_abi_cxx11_(this);
    pcVar5 = (char *)std::__cxx11::string::data();
    trailing_comments_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(pcVar5,iVar2,SERIALIZE);
    psVar6 = trailing_comments_abi_cxx11_(this);
    uVar3 = internal::WireFormatLite::MakeTag(4,WIRETYPE_LENGTH_DELIMITED);
    if (uVar3 < 0x80) {
      *_i_1 = (byte)uVar3;
      local_28 = _i_1 + 1;
    }
    else if (uVar3 < 0x4000) {
      *_i_1 = (byte)uVar3 | 0x80;
      _i_1[1] = (byte)(uVar3 >> 7);
      local_28 = _i_1 + 2;
    }
    else {
      local_28 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,_i_1);
    }
    uVar3 = std::__cxx11::string::size();
    puVar7 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,local_28);
    _i_1 = io::CodedOutputStream::WriteStringToArray(psVar6,puVar7);
  }
  pUVar8 = unknown_fields(this);
  bVar1 = UnknownFieldSet::empty(pUVar8);
  if (!bVar1) {
    pUVar8 = unknown_fields(this);
    _i_1 = internal::WireFormat::SerializeUnknownFieldsToArray(pUVar8,_i_1);
  }
  return _i_1;
}

Assistant:

::google::protobuf::uint8* SourceCodeInfo_Location::SerializeWithCachedSizesToArray(
    ::google::protobuf::uint8* target) const {
  // repeated int32 path = 1 [packed = true];
  if (this->path_size() > 0) {
    target = ::google::protobuf::internal::WireFormatLite::WriteTagToArray(
      1,
      ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED,
      target);
    target = ::google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(
      _path_cached_byte_size_, target);
  }
  for (int i = 0; i < this->path_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteInt32NoTagToArray(this->path(i), target);
  }

  // repeated int32 span = 2 [packed = true];
  if (this->span_size() > 0) {
    target = ::google::protobuf::internal::WireFormatLite::WriteTagToArray(
      2,
      ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED,
      target);
    target = ::google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(
      _span_cached_byte_size_, target);
  }
  for (int i = 0; i < this->span_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteInt32NoTagToArray(this->span(i), target);
  }

  // optional string leading_comments = 3;
  if (has_leading_comments()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->leading_comments().data(), this->leading_comments().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        3, this->leading_comments(), target);
  }

  // optional string trailing_comments = 4;
  if (has_trailing_comments()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->trailing_comments().data(), this->trailing_comments().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        4, this->trailing_comments(), target);
  }

  if (!unknown_fields().empty()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  return target;
}